

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O0

bool __thiscall
tinyusdz::AssetResolutionResolver::open_asset
          (AssetResolutionResolver *this,string *resolvedPath,string *assetPath,Asset *asset_out,
          string *warn,string *err)

{
  FSSizeAsset p_Var1;
  FSReadAsset p_Var2;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  size_t sVar7;
  uint8_t *puVar8;
  size_t max_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint64_t read_size;
  Asset asset;
  pointer puStack_70;
  int ret;
  uint64_t sz;
  void *userdata;
  string ext;
  string *err_local;
  string *warn_local;
  Asset *asset_out_local;
  string *assetPath_local;
  string *resolvedPath_local;
  AssetResolutionResolver *this_local;
  
  if (asset_out == (Asset *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)err,"`asset` arg is nullptr.");
    }
    this_local._7_1_ = false;
  }
  else {
    io::GetFileExtension((string *)&userdata,(string *)resolvedPath);
    sVar4 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                     *)(this + 0x48),(key_type *)&userdata);
    if (((sVar4 == 0) ||
        (pmVar5 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                        *)(this + 0x48),(key_type *)&userdata), pmVar5->size_fun == (FSSizeAsset)0x0
        )) || (pmVar5 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                        ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                              *)(this + 0x48),(key_type *)&userdata),
              pmVar5->read_fun == (FSReadAsset)0x0)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
      bVar3 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes,
                                (string *)err,(string *)resolvedPath,*(long *)(this + 0x40) << 0x14,
                                (void *)0x0);
      if (bVar3) {
        Asset::set_data(asset_out,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
        this_local._7_1_ = true;
      }
      else {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=((string *)err,"Open asset from a file failed.\n");
        }
        this_local._7_1_ = false;
      }
      asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    }
    else {
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                     *)(this + 0x48),(key_type *)&userdata);
      sz = (uint64_t)pmVar5->userdata;
      puStack_70 = (pointer)0x0;
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                     *)(this + 0x48),(key_type *)&userdata);
      p_Var1 = pmVar5->size_fun;
      pcVar6 = (char *)::std::__cxx11::string::c_str();
      asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           (*p_Var1)(pcVar6,(uint64_t *)&stack0xffffffffffffff90,err,(void *)sz);
      if (asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        Asset::Asset((Asset *)&read_size);
        Asset::resize((Asset *)&read_size,(size_t)puStack_70);
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                 ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                       *)(this + 0x48),(key_type *)&userdata);
        p_Var2 = pmVar5->read_fun;
        pcVar6 = (char *)::std::__cxx11::string::c_str();
        sVar7 = Asset::size((Asset *)&read_size);
        puVar8 = Asset::data((Asset *)&read_size);
        asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (*p_Var2)(pcVar6,sVar7,puVar8,
                       (uint64_t *)
                       &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,err,(void *)sz);
        if (asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < puStack_70) {
            Asset::resize((Asset *)&read_size,
                          (size_t)data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            Asset::shrink_to_fit((Asset *)&read_size);
          }
          Asset::operator=(asset_out,(Asset *)&read_size);
          this_local._7_1_ = true;
        }
        else {
          if (err != (string *)0x0) {
            ::std::__cxx11::string::operator+=((string *)err,"Read asset through handler failed.\n")
            ;
          }
          this_local._7_1_ = false;
        }
        asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        Asset::~Asset((Asset *)&read_size);
      }
      else {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=
                    ((string *)err,"Get size of asset through handler failed.\n");
        }
        this_local._7_1_ = false;
        asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
    }
    ::std::__cxx11::string::~string((string *)&userdata);
  }
  return this_local._7_1_;
}

Assistant:

bool AssetResolutionResolver::open_asset(const std::string &resolvedPath, const std::string &assetPath,
                  Asset *asset_out, std::string *warn, std::string *err) const {

  if (!asset_out) {
    if (err) {
      (*err) = "`asset` arg is nullptr.";
    }
    return false;
  }

  DCOUT("Opening asset: " << resolvedPath);

  (void)assetPath;
  (void)warn;

  std::string ext = io::GetFileExtension(resolvedPath);

  if (_asset_resolution_handlers.count(ext)) {
    if (_asset_resolution_handlers.at(ext).size_fun && _asset_resolution_handlers.at(ext).read_fun) {

      // Use custom handler's userdata
      void *userdata = _asset_resolution_handlers.at(ext).userdata;

      // Get asset size.
      uint64_t sz{0};
      int ret = _asset_resolution_handlers.at(ext).size_fun(resolvedPath.c_str(), &sz, err, userdata);
      if (ret != 0) {
        if (err) {
          (*err) += "Get size of asset through handler failed.\n";
        }
        return false;
      }
    
      DCOUT("asset_size: " << sz);

      tinyusdz::Asset asset;
      asset.resize(size_t(sz));

      uint64_t read_size{0};

      ret = _asset_resolution_handlers.at(ext).read_fun(resolvedPath.c_str(), /* req_size */asset.size(), asset.data(), &read_size, err, userdata);

      if (ret != 0) {
        if (err) {
          (*err) += "Read asset through handler failed.\n";
        }
        return false;
      }

      if (read_size < sz) {
        asset.resize(size_t(read_size));
        // May optimize memory usage
        asset.shrink_to_fit();
      }

      (*asset_out) = std::move(asset);

      return true;
    } else {
      DCOUT("Resolve function is nullptr. Fallback to built-in file handler.");
    }
  }

  // Default: read from a file.
  std::vector<uint8_t> data;
  size_t max_bytes = 1024 * 1024 * _max_asset_bytes_in_mb;
  if (!io::ReadWholeFile(&data, err, resolvedPath, max_bytes,
                           /* userdata */ nullptr)) {

    if (err) {
      (*err) += "Open asset from a file failed.\n";
    }

    return false;
  }

  asset_out->set_data(std::move(data));

  return true;
}